

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<google::protobuf::Descriptor_const*>>
::AssertHashEqConsistent<google::protobuf::Descriptor_const*>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<google::protobuf::Descriptor_const*>>
           *this,Descriptor **key)

{
  Descriptor *pDVar1;
  slot_type pDVar2;
  uint uVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Descriptor **key_1;
  slot_type *ppDVar13;
  uintptr_t v;
  ulong uVar14;
  ulong uVar15;
  undefined1 (*pauVar16) [16];
  uint uVar17;
  ushort uVar18;
  
  if (1 < *(ulong *)(this + 8)) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (long)*key;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = &(*key)->super_SymbolBase +
                   (SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),0) ^
                   SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),8));
    uVar14 = SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),8) ^
             SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),0);
    uVar15 = *(ulong *)this;
    if (uVar15 == 1) {
      ppDVar13 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                 ::soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                             *)this);
      pDVar2 = *ppDVar13;
      if ((pDVar2 == *key) &&
         (auVar9._8_8_ = 0,
         auVar9._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (long)pDVar2,
         auVar10._8_8_ = 0,
         auVar10._0_8_ =
              &pDVar2->super_SymbolBase +
              (SUB168(auVar9 * ZEXT816(0x9ddfea08eb382d69),0) ^
              SUB168(auVar9 * ZEXT816(0x9ddfea08eb382d69),8)),
         uVar14 != (SUB168(auVar10 * ZEXT816(0x9ddfea08eb382d69),8) ^
                   SUB168(auVar10 * ZEXT816(0x9ddfea08eb382d69),0)))) {
LAB_0021d7c0:
        __assert_fail("hash_of_arg == once_more_hash_arg && \"hash is not idempotent.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xf10,
                      "auto absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<const google::protobuf::Descriptor *>>::AssertHashEqConsistent(const google::protobuf::Descriptor *const &)::(anonymous class)::operator()(const ctrl_t *, slot_type *) const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<const google::protobuf::Descriptor *>]"
                     );
      }
    }
    else {
      if (uVar15 == 0) {
        __assert_fail("!kEnabled || cap >= kCapacity",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xb37,
                      "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<const google::protobuf::Descriptor *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<const google::protobuf::Descriptor *>]"
                     );
      }
      if (uVar15 < 0x11) {
        ppDVar13 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                   ::slot_array((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                 *)this);
        uVar15 = *(ulong *)this;
        pauVar16 = *(undefined1 (**) [16])(this + 0x10);
        if (uVar15 < 0xf) {
          if (8 < uVar15) {
            __assert_fail("cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x753,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::Descriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                         );
          }
          uVar15 = *(ulong *)(*pauVar16 + uVar15) & 0x8080808080808080;
          if (uVar15 != 0x8080808080808080) {
            pDVar1 = *key;
            auVar7._8_8_ = 0;
            auVar7._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (long)pDVar1;
            auVar8._8_8_ = 0;
            auVar8._0_8_ = &pDVar1->super_SymbolBase +
                           (SUB168(auVar7 * ZEXT816(0x9ddfea08eb382d69),0) ^
                           SUB168(auVar7 * ZEXT816(0x9ddfea08eb382d69),8));
            uVar15 = uVar15 ^ 0x8080808080808080;
            do {
              lVar4 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
                }
              }
              if ((*(Descriptor **)((long)ppDVar13 + ((ulong)((uint)lVar4 & 0xfffffff8) - 8)) ==
                   pDVar1) &&
                 (uVar14 != (SUB168(auVar8 * ZEXT816(0x9ddfea08eb382d69),8) ^
                            SUB168(auVar8 * ZEXT816(0x9ddfea08eb382d69),0)))) goto LAB_0021d7c0;
              uVar15 = uVar15 & uVar15 - 1;
            } while (uVar15 != 0);
          }
        }
        else if (1 < *(ulong *)(this + 8)) {
          pDVar2 = *key;
          auVar11._8_8_ = 0;
          auVar11._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (long)pDVar2;
          auVar12._8_8_ = 0;
          auVar12._0_8_ =
               &pDVar2->super_SymbolBase +
               (SUB168(auVar11 * ZEXT816(0x9ddfea08eb382d69),0) ^
               SUB168(auVar11 * ZEXT816(0x9ddfea08eb382d69),8));
          uVar15 = *(ulong *)(this + 8) >> 1;
          do {
            auVar5 = *pauVar16;
            uVar17 = (uint)(ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                                   (ushort)(byte)(auVar5[0xf] >> 7) << 0xf);
            if (uVar17 != 0xffff) {
              uVar17 = ~uVar17;
              do {
                uVar3 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
                  }
                }
                if ((char)(*pauVar16)[uVar3] < '\0') {
                  __assert_fail("IsFull(ctrl[i]) && \"hash table was modified unexpectedly\"",
                                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                                ,0x764,
                                "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::Descriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                               );
                }
                if ((ppDVar13[uVar3] == pDVar2) &&
                   (uVar14 != (SUB168(auVar12 * ZEXT816(0x9ddfea08eb382d69),8) ^
                              SUB168(auVar12 * ZEXT816(0x9ddfea08eb382d69),0)))) goto LAB_0021d7c0;
                uVar15 = uVar15 - 1;
                uVar18 = (ushort)(uVar17 - 1) & (ushort)uVar17;
                uVar17 = CONCAT22((short)(uVar17 - 1 >> 0x10),uVar18);
              } while (uVar18 != 0);
              if (uVar15 == 0) {
                return;
              }
            }
            pauVar16 = pauVar16 + 1;
            ppDVar13 = ppDVar13 + 0x10;
            if (auVar5[0xf] == 0xff) {
              __assert_fail("(remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x76b,
                            "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::Descriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                           );
            }
          } while( true );
        }
      }
    }
  }
  return;
}

Assistant:

size_t capacity() const {
    const size_t cap = common().capacity();
    // Compiler complains when using functions in assume so use local variables.
    ABSL_ATTRIBUTE_UNUSED static constexpr bool kEnabled = SooEnabled();
    ABSL_ATTRIBUTE_UNUSED static constexpr size_t kCapacity = SooCapacity();
    ABSL_ASSUME(!kEnabled || cap >= kCapacity);
    return cap;
  }